

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * hostsPath_abi_cxx11_(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string local_30 [40];
  
  configDir_abi_cxx11_();
  path<std::__cxx11::string,char_const*>(in_RDI,(char *)local_30);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

std::string hostsPath() {
    return path(configDir(), "hosts");
}